

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O2

Fxu_Matrix * Fxu_MatrixAllocate(void)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  Fxu_Matrix *pFVar4;
  Fxu_ListDouble *pFVar5;
  Extra_MmFixed_t *pEVar6;
  Fxu_HeapDouble *pFVar7;
  Fxu_HeapSingle *pFVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  
  pFVar4 = (Fxu_Matrix *)calloc(1,0xd0);
  uVar11 = 9999;
  do {
    do {
      uVar1 = uVar11 + 1;
      uVar3 = uVar11 & 1;
      uVar11 = uVar1;
    } while (uVar3 != 0);
    uVar13 = 3;
    do {
      iVar12 = (int)uVar13;
      if (uVar1 < (uint)(iVar12 * iVar12)) {
        pFVar4->nTableSize = uVar1;
        pFVar5 = (Fxu_ListDouble *)calloc(1,(long)(int)uVar1 * 0x18);
        pFVar4->pTable = pFVar5;
        pEVar6 = Extra_MmFixedStart(0x48);
        pFVar4->pMemMan = pEVar6;
        pFVar7 = Fxu_HeapDoubleStart();
        pFVar4->pHeapDouble = pFVar7;
        pFVar8 = Fxu_HeapSingleStart();
        pFVar4->pHeapSingle = pFVar8;
        pVVar9 = (Vec_Ptr_t *)malloc(0x10);
        pVVar9->nCap = 100;
        pVVar9->nSize = 0;
        ppvVar10 = (void **)malloc(800);
        pVVar9->pArray = ppvVar10;
        pFVar4->vPairs = pVVar9;
        return pFVar4;
      }
      uVar2 = (ulong)uVar1 % uVar13;
      uVar13 = (ulong)(iVar12 + 2);
    } while ((int)uVar2 != 0);
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Fxu_Matrix * Fxu_MatrixAllocate()
{
	Fxu_Matrix * p;
	p = ABC_ALLOC( Fxu_Matrix, 1 );
	memset( p, 0, sizeof(Fxu_Matrix) );
	p->nTableSize = Abc_PrimeCudd(10000);
	p->pTable = ABC_ALLOC( Fxu_ListDouble, p->nTableSize );
	memset( p->pTable, 0, sizeof(Fxu_ListDouble) * p->nTableSize );
#ifndef USE_SYSTEM_MEMORY_MANAGEMENT
    {
        // get the largest size in bytes for the following structures:
        // Fxu_Cube, Fxu_Var, Fxu_Lit, Fxu_Pair, Fxu_Double, Fxu_Single
        // (currently, Fxu_Var, Fxu_Pair, Fxu_Double take 10 machine words)
        int nSizeMax, nSizeCur;
        nSizeMax = -1;
        nSizeCur = sizeof(Fxu_Cube);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Var);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Lit);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Pair);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Double);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Single);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
    	p->pMemMan  = Extra_MmFixedStart( nSizeMax ); 
    }
#endif
	p->pHeapDouble = Fxu_HeapDoubleStart();
	p->pHeapSingle = Fxu_HeapSingleStart();
    p->vPairs = Vec_PtrAlloc( 100 );
	return p;
}